

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_opt_step_adamw(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  uint *puVar26;
  long lVar27;
  long lVar28;
  char *pcVar29;
  long lVar30;
  int iVar31;
  undefined8 uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [64];
  
  pgVar7 = dst->src[0];
  if (pgVar7->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x2266,"fatal error");
  }
  pgVar8 = dst->src[1];
  pgVar9 = dst->src[2];
  pgVar10 = dst->src[3];
  pgVar11 = dst->src[4];
  cVar22 = ggml_are_same_shape(pgVar7,pgVar8);
  if (cVar22 == '\0') {
    pcVar29 = "ggml_are_same_shape(src0, src0_grad)";
    uVar32 = 0x2221;
  }
  else {
    cVar22 = ggml_are_same_shape(pgVar7,pgVar9);
    if (cVar22 == '\0') {
      pcVar29 = "ggml_are_same_shape(src0, src0_grad_m)";
      uVar32 = 0x2222;
    }
    else {
      cVar22 = ggml_are_same_shape(pgVar7,pgVar10);
      if (cVar22 == '\0') {
        pcVar29 = "ggml_are_same_shape(src0, src0_grad_v)";
        uVar32 = 0x2223;
      }
      else {
        lVar25 = ggml_nelements(pgVar11);
        if (lVar25 == 7) {
          iVar31 = params->ith;
          iVar24 = params->nth;
          iVar23 = ggml_nrows(pgVar7);
          if (pgVar7->nb[0] == 4) {
            lVar25 = pgVar7->ne[0];
            lVar12 = pgVar7->ne[1];
            lVar28 = pgVar7->ne[2];
            sVar13 = pgVar7->nb[1];
            sVar14 = pgVar7->nb[2];
            sVar15 = pgVar7->nb[3];
            iVar24 = (iVar24 + -1 + iVar23) / iVar24;
            iVar31 = iVar31 * iVar24;
            iVar24 = iVar24 + iVar31;
            if (iVar23 <= iVar24) {
              iVar24 = iVar23;
            }
            puVar26 = (uint *)ggml_get_data_f32(pgVar11);
            if (iVar31 < iVar24) {
              fVar1 = (float)puVar26[1];
              fVar2 = (float)puVar26[2];
              fVar3 = (float)puVar26[3];
              fVar4 = (float)puVar26[5];
              fVar5 = (float)puVar26[6];
              lVar28 = lVar28 * lVar12;
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar34 = vxorps_avx512vl(ZEXT416(*puVar26),auVar21);
              auVar21 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416(*puVar26),
                                         ZEXT416(puVar26[4]));
              auVar36 = ZEXT1664(auVar21);
              lVar27 = (long)iVar31;
              do {
                lVar30 = lVar27 % lVar28;
                if (0 < lVar25) {
                  lVar30 = (lVar30 % lVar12) * sVar13 + (lVar27 / lVar28) * sVar15 +
                           (lVar30 / lVar12) * sVar14;
                  pvVar16 = pgVar7->data;
                  pvVar17 = pgVar10->data;
                  pvVar18 = pgVar8->data;
                  pvVar19 = pgVar9->data;
                  lVar33 = 0;
                  do {
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - fVar1) *
                                                            *(float *)((long)pvVar18 +
                                                                      lVar33 * 4 + lVar30))),
                                              ZEXT416((uint)fVar1),
                                              ZEXT416(*(uint *)((long)pvVar19 + lVar33 * 4 + lVar30)
                                                     ));
                    *(int *)((long)pvVar19 + lVar33 * 4 + lVar30) = auVar20._0_4_;
                    fVar6 = *(float *)((long)pvVar18 + lVar33 * 4 + lVar30);
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - fVar2) * fVar6 * fVar6)),
                                              ZEXT416((uint)fVar2),
                                              ZEXT416(*(uint *)((long)pvVar17 + lVar33 * 4 + lVar30)
                                                     ));
                    *(float *)((long)pvVar17 + lVar33 * 4 + lVar30) = auVar20._0_4_;
                    fVar6 = *(float *)((long)pvVar19 + lVar33 * 4 + lVar30);
                    fVar35 = fVar5 * auVar20._0_4_;
                    if (fVar35 < 0.0) {
                      fVar35 = sqrtf(fVar35);
                      auVar36 = ZEXT464(auVar21._0_4_);
                    }
                    else {
                      auVar20 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
                      fVar35 = auVar20._0_4_;
                    }
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)((auVar34._0_4_ * fVar4 * fVar6) /
                                                            (fVar3 + fVar35))),auVar36._0_16_,
                                              ZEXT416(*(uint *)((long)pvVar16 + lVar33 * 4 + lVar30)
                                                     ));
                    *(int *)((long)pvVar16 + lVar33 * 4 + lVar30) = auVar20._0_4_;
                    lVar33 = lVar33 + 1;
                  } while (lVar25 != lVar33);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 != iVar24);
            }
            return;
          }
          pcVar29 = "nb00 == sizeof(float)";
          uVar32 = 0x222c;
        }
        else {
          pcVar29 = "ggml_nelements(adamw_params) == 7";
          uVar32 = 0x2224;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar32,"GGML_ASSERT(%s) failed",pcVar29);
}

Assistant:

void ggml_compute_forward_opt_step_adamw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_opt_step_adamw_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}